

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkCommsInterface.cpp
# Opt level: O1

ActionMessage * __thiscall
helics::NetworkCommsInterface::generateReplyToIncomingMessage
          (ActionMessage *__return_storage_ptr__,NetworkCommsInterface *this,ActionMessage *cmd)

{
  action_t aVar1;
  uint uVar2;
  size_t sVar3;
  byte *pbVar4;
  int iVar5;
  uint uVar6;
  string_view host;
  string_view host_00;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  aVar1 = cmd->messageAction;
  if (((aVar1 == cmd_protocol_priority) || (aVar1 == cmd_protocol_big)) || (aVar1 == cmd_protocol))
  {
    iVar5 = cmd->messageID;
    if (iVar5 == 0x12d) {
      ActionMessage::ActionMessage(__return_storage_ptr__,cmd_protocol);
      __return_storage_ptr__->messageID = 0x130;
      return __return_storage_ptr__;
    }
    if (iVar5 == 0x5af) {
      uVar2._0_2_ = cmd->counter;
      uVar2._2_2_ = cmd->flags;
      uVar6 = 2;
      if ((undefined2)uVar2 != 0) {
        uVar6 = uVar2;
      }
      sVar3 = (cmd->payload).bufferSize;
      if (sVar3 == 0) {
        host_00._M_str = "localhost";
        host_00._M_len = 9;
        iVar5 = findOpenPort(this,uVar6 & 0xffff,host_00);
      }
      else {
        pbVar4 = (cmd->payload).heap;
        local_50 = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pbVar4,pbVar4 + sVar3);
        host._M_str = (char *)local_50;
        host._M_len = local_48;
        iVar5 = findOpenPort(this,uVar6 & 0xffff,host);
        if (local_50 != local_40) {
          operator_delete(local_50,local_40[0] + 1);
        }
      }
      ActionMessage::ActionMessage(__return_storage_ptr__,cmd_protocol);
      __return_storage_ptr__->messageID = 0x5ab;
      (__return_storage_ptr__->source_id).gid = (this->PortNumber).super___atomic_base<int>._M_i;
      (__return_storage_ptr__->dest_handle).hid = iVar5;
      __return_storage_ptr__->counter = cmd->counter;
      return __return_storage_ptr__;
    }
    if (iVar5 == 0x5ad) {
      ActionMessage::ActionMessage(__return_storage_ptr__,cmd_protocol);
      __return_storage_ptr__->messageID = 0x5ab;
      (__return_storage_ptr__->dest_handle).hid = (this->PortNumber).super___atomic_base<int>._M_i;
      return __return_storage_ptr__;
    }
  }
  ActionMessage::ActionMessage(__return_storage_ptr__,cmd_ignore);
  return __return_storage_ptr__;
}

Assistant:

ActionMessage NetworkCommsInterface::generateReplyToIncomingMessage(ActionMessage& cmd)
{
    if (isProtocolCommand(cmd)) {
        switch (cmd.messageID) {
            case QUERY_PORTS: {
                ActionMessage portReply(CMD_PROTOCOL);
                portReply.messageID = PORT_DEFINITIONS;
                portReply.setExtraData(PortNumber);
                return portReply;
            } break;
            case REQUEST_PORTS: {
                int cnt = (cmd.counter == 0) ? 2 : cmd.counter;
                auto openPort = (cmd.name().empty()) ? findOpenPort(cnt, localHostString) :
                                                       findOpenPort(cnt, std::string(cmd.name()));
                ActionMessage portReply(CMD_PROTOCOL);
                portReply.messageID = PORT_DEFINITIONS;
                portReply.source_id = GlobalFederateId(PortNumber);
                portReply.setExtraData(openPort);
                portReply.counter = cmd.counter;
                return portReply;
            } break;
            case CONNECTION_REQUEST: {
                ActionMessage connAck(CMD_PROTOCOL);
                connAck.messageID = CONNECTION_ACK;
                return connAck;
            } break;
            default:
                break;
        }
    }
    ActionMessage resp(CMD_IGNORE);
    return resp;
}